

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int nghttp2_hd_deflate_hd_bufs
              (nghttp2_hd_deflater *deflater,nghttp2_bufs *bufs,nghttp2_nv *nv,size_t nvlen)

{
  ulong table_size;
  size_t min_hd_table_bufsize_max;
  ulong uStack_38;
  int rv;
  size_t i;
  size_t nvlen_local;
  nghttp2_nv *nv_local;
  nghttp2_bufs *bufs_local;
  nghttp2_hd_deflater *deflater_local;
  
  if ((deflater->ctx).bad == '\0') {
    if (deflater->notify_table_size_change != '\0') {
      table_size = deflater->min_hd_table_bufsize_max;
      deflater->notify_table_size_change = '\0';
      deflater->min_hd_table_bufsize_max = 0xffffffff;
      if (((table_size < (deflater->ctx).hd_table_bufsize_max) &&
          (min_hd_table_bufsize_max._4_4_ = emit_table_size(bufs,table_size),
          min_hd_table_bufsize_max._4_4_ != 0)) ||
         (min_hd_table_bufsize_max._4_4_ =
               emit_table_size(bufs,(deflater->ctx).hd_table_bufsize_max),
         min_hd_table_bufsize_max._4_4_ != 0)) {
LAB_001947e5:
        (deflater->ctx).bad = '\x01';
        return min_hd_table_bufsize_max._4_4_;
      }
    }
    for (uStack_38 = 0; uStack_38 < nvlen; uStack_38 = uStack_38 + 1) {
      min_hd_table_bufsize_max._4_4_ = deflate_nv(deflater,bufs,nv + uStack_38);
      if (min_hd_table_bufsize_max._4_4_ != 0) goto LAB_001947e5;
    }
    deflater_local._4_4_ = 0;
  }
  else {
    deflater_local._4_4_ = -0x20b;
  }
  return deflater_local._4_4_;
}

Assistant:

int nghttp2_hd_deflate_hd_bufs(nghttp2_hd_deflater *deflater,
                               nghttp2_bufs *bufs, const nghttp2_nv *nv,
                               size_t nvlen) {
  size_t i;
  int rv = 0;

  if (deflater->ctx.bad) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  if (deflater->notify_table_size_change) {
    size_t min_hd_table_bufsize_max;

    min_hd_table_bufsize_max = deflater->min_hd_table_bufsize_max;

    deflater->notify_table_size_change = 0;
    deflater->min_hd_table_bufsize_max = UINT32_MAX;

    if (deflater->ctx.hd_table_bufsize_max > min_hd_table_bufsize_max) {

      rv = emit_table_size(bufs, min_hd_table_bufsize_max);

      if (rv != 0) {
        goto fail;
      }
    }

    rv = emit_table_size(bufs, deflater->ctx.hd_table_bufsize_max);

    if (rv != 0) {
      goto fail;
    }
  }

  for (i = 0; i < nvlen; ++i) {
    rv = deflate_nv(deflater, bufs, &nv[i]);
    if (rv != 0) {
      goto fail;
    }
  }

  DEBUGF("deflatehd: all input name/value pairs were deflated\n");

  return 0;
fail:
  DEBUGF("deflatehd: error return %d\n", rv);

  deflater->ctx.bad = 1;
  return rv;
}